

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

real __thiscall fasttext::Model::softmax(Model *this,int32_t target,real lr)

{
  float a;
  real *prVar1;
  ulong i;
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  undefined1 extraout_var [56];
  
  Vector::zero(&this->grad_);
  computeOutputSoftmax(this);
  for (i = 0; (long)i < (long)this->osz_; i = i + 1) {
    prVar1 = Vector::operator[](&this->output_,i);
    a = ((float)((uint)((uint)target == i) * 0x3f800000) - *prVar1) * lr;
    Vector::addRow(&this->grad_,
                   (this->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,i,a);
    Matrix::addRow((this->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,&this->hidden_,i,a);
  }
  prVar1 = Vector::operator[](&this->output_,(long)target);
  auVar3._0_8_ = utils::log((double)(ulong)(uint)*prVar1);
  auVar3._8_56_ = extraout_var;
  auVar2._8_4_ = 0x80000000;
  auVar2._0_8_ = 0x8000000080000000;
  auVar2._12_4_ = 0x80000000;
  auVar2 = vxorps_avx512vl(auVar3._0_16_,auVar2);
  return auVar2._0_4_;
}

Assistant:

real Model::softmax(int32_t target, real lr) {
  grad_.zero();
  computeOutputSoftmax();
  for (int32_t i = 0; i < osz_; i++) {
    real label = (i == target) ? 1.0 : 0.0;
    real alpha = lr * (label - output_[i]);
    grad_.addRow(*wo_, i, alpha);
    wo_->addRow(hidden_, i, alpha);
  }
  return -utils::log(output_[target]);
}